

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# temporary_file_manager.cpp
# Opt level: O3

bool __thiscall
duckdb::TemporaryFileManager::HasTemporaryBuffer(TemporaryFileManager *this,block_id_t block_id)

{
  int iVar1;
  iterator iVar2;
  block_id_t local_20;
  
  local_20 = block_id;
  iVar1 = pthread_mutex_lock((pthread_mutex_t *)&this->manager_lock);
  if (iVar1 == 0) {
    iVar2 = ::std::
            _Hashtable<long,_std::pair<const_long,_duckdb::TemporaryFileIndex>,_std::allocator<std::pair<const_long,_duckdb::TemporaryFileIndex>_>,_std::__detail::_Select1st,_std::equal_to<long>,_std::hash<long>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
            ::find(&(this->used_blocks)._M_h,&local_20);
    pthread_mutex_unlock((pthread_mutex_t *)&this->manager_lock);
    return iVar2.super__Node_iterator_base<std::pair<const_long,_duckdb::TemporaryFileIndex>,_false>
           ._M_cur != (__node_type *)0x0;
  }
  ::std::__throw_system_error(iVar1);
}

Assistant:

bool TemporaryFileManager::HasTemporaryBuffer(block_id_t block_id) {
	lock_guard<mutex> lock(manager_lock);
	return used_blocks.find(block_id) != used_blocks.end();
}